

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

bool testing::internal::
     TypeParameterizedTest<NoiseModelUpdateTest,_testing::internal::TemplateSel<gtest_suite_NoiseModelUpdateTest_::UpdateFailsBlockSizeTooSmall>,_testing::internal::Types<BitDepthParams<unsigned_char,_8,_false>,_BitDepthParams<unsigned_short,_8,_true>,_BitDepthParams<unsigned_short,_10,_true>,_BitDepthParams<unsigned_short,_12,_true>_>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  bool bVar1;
  char *str;
  char *in_RCX;
  CodeLocation *in_RDX;
  char *in_RSI;
  char *in_RDI;
  int in_R8D;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R9;
  CodeLocation *in_stack_fffffffffffffe28;
  CodeLocation *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  string *in_stack_fffffffffffffe68;
  int line_num;
  string local_148 [32];
  string local_128 [32];
  string local_108 [16];
  TypeId in_stack_ffffffffffffff08;
  CodeLocation *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  SetUpTestSuiteFunc in_stack_ffffffffffffff40;
  TearDownTestSuiteFunc in_stack_ffffffffffffff48;
  TestFactoryBase *in_stack_ffffffffffffff50;
  string local_90 [32];
  string local_70 [32];
  string local_50 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc8;
  int index_00;
  undefined4 in_stack_ffffffffffffffd8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff30,in_RDI,(allocator *)&stack0xffffffffffffff2f);
  std::operator+(in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
  std::operator+(in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
  std::operator+(in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_R9,(long)in_R8D);
  index_00 = (int)((ulong)in_R9 >> 0x20);
  std::operator+(in_stack_fffffffffffffe38,&in_stack_fffffffffffffe30->file);
  str = (char *)std::__cxx11::string::c_str();
  GetPrefixUntilComma_abi_cxx11_(str);
  line_num = (int)((ulong)str >> 0x20);
  StripTrailingSpaces(in_stack_fffffffffffffe68);
  std::__cxx11::string::c_str();
  GetTypeName<BitDepthParams<unsigned_char,8,false>>();
  std::__cxx11::string::c_str();
  CodeLocation::CodeLocation(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  GetTypeId<NoiseModelUpdateTest<BitDepthParams<unsigned_char,8,false>>>();
  std::__cxx11::string::c_str();
  SuiteApiResolver<gtest_suite_NoiseModelUpdateTest_::UpdateFailsBlockSizeTooSmall<BitDepthParams<unsigned_char,_8,_false>_>_>
  ::GetSetUpCaseOrSuite(in_RDI,line_num);
  std::__cxx11::string::c_str();
  SuiteApiResolver<gtest_suite_NoiseModelUpdateTest_::UpdateFailsBlockSizeTooSmall<BitDepthParams<unsigned_char,_8,_false>_>_>
  ::GetTearDownCaseOrSuite(in_RDI,line_num);
  operator_new(8);
  TestFactoryImpl<gtest_suite_NoiseModelUpdateTest_::UpdateFailsBlockSizeTooSmall<BitDepthParams<unsigned_char,_8,_false>_>_>
  ::TestFactoryImpl((TestFactoryImpl<gtest_suite_NoiseModelUpdateTest_::UpdateFailsBlockSizeTooSmall<BitDepthParams<unsigned_char,_8,_false>_>_>
                     *)in_stack_fffffffffffffe30);
  MakeAndRegisterTestInfo
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,in_stack_ffffffffffffff50);
  CodeLocation::~CodeLocation((CodeLocation *)0x5c7337);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
  bVar1 = TypeParameterizedTest<NoiseModelUpdateTest,_testing::internal::TemplateSel<gtest_suite_NoiseModelUpdateTest_::UpdateFailsBlockSizeTooSmall>,_testing::internal::Types<BitDepthParams<unsigned_short,_8,_true>,_BitDepthParams<unsigned_short,_10,_true>,_BitDepthParams<unsigned_short,_12,_true>_>_>
          ::Register(in_RSI,in_RDX,in_RCX,(char *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                     index_00,in_stack_ffffffffffffffc8);
  return bVar1;
}

Assistant:

static bool Register(const char* prefix, const CodeLocation& code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)])
            .c_str(),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel,
                                 typename Types::Tail>::Register(prefix,
                                                                 code_location,
                                                                 case_name,
                                                                 test_names,
                                                                 index + 1,
                                                                 type_names);
  }